

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cc
# Opt level: O0

void __thiscall
google::anon_unknown_8::LogFileObject::Write
          (LogFileObject *this,bool force_flush,time_point *timestamp,char *message,
          size_t message_len)

{
  lock_guard<std::mutex> __n;
  bool bVar1;
  bool bVar2;
  uint32 uVar3;
  _Setw _Var4;
  int32 iVar5;
  uint uVar6;
  int __fd;
  ulong uVar7;
  ostream *poVar8;
  undefined8 uVar9;
  string *psVar10;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  string *psVar11;
  size_t __n_00;
  void *__ptr;
  int *piVar12;
  FILE *pFVar13;
  duration<int,_std::ratio<1L,_1L>_> *secs;
  char *pcVar14;
  uint32 this_drop_length;
  uint32 total_drop_length;
  size_t header_len;
  size_t *local_5f0;
  string *file_header_string;
  rep_conflict local_5dc;
  string local_5d8;
  char *local_5b8;
  char *date_time_format;
  int local_5a8;
  int local_5a4;
  int local_5a0;
  int local_59c;
  undefined1 local_598 [8];
  ostringstream file_header_stream;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_420;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_400;
  reference local_3e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *log_dir;
  const_iterator __end4;
  const_iterator __begin4;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range4;
  bool success;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *log_dirs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_390;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_370;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_350;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_330;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_310;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2f0;
  undefined1 local_2d0 [8];
  string uidname;
  string hostname;
  undefined1 local_288 [8];
  string stripped_filename;
  string *time_pid_string;
  long local_228;
  ostringstream time_pid_stream;
  time_t local_b0;
  time_t t;
  tm tm_time;
  undefined1 local_60 [8];
  ScopedExit<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_sergiud[P]glog_src_logging_cc:1096:22)>
  cleanupAtEnd;
  anon_class_16_2_2fb5f48e_for_functor_ cleanupLogs;
  lock_guard<std::mutex> local_38;
  lock_guard<std::mutex> l;
  size_t message_len_local;
  char *message_local;
  time_point *timestamp_local;
  bool force_flush_local;
  LogFileObject *this_local;
  
  l._M_device = (mutex_type *)message_len;
  std::lock_guard<std::mutex>::lock_guard(&local_38,&this->mutex_);
  if (((this->base_filename_selected_ & 1U) != 0) &&
     (uVar7 = std::__cxx11::string::empty(), (uVar7 & 1) != 0)) goto LAB_001145b3;
  cleanupAtEnd.functor_.current_time.__d.__r = (duration)(duration)this;
  glog_internal_namespace_::
  ScopedExit<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/sergiud[P]glog/src/logging.cc:1096:22)>
  ::
  ScopedExit<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_sergiud[P]glog_src_logging_cc:1096:22)_&,_nullptr>
            ((ScopedExit<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_sergiud[P]glog_src_logging_cc:1096:22)>
              *)local_60,
             (anon_class_16_2_2fb5f48e_for_functor_ *)&cleanupAtEnd.functor_.current_time);
  uVar6 = this->file_length_;
  uVar3 = MaxLogSize();
  if ((uVar3 <= uVar6 >> 0x14) || (bVar1 = glog_internal_namespace_::PidHasChanged(), bVar1)) {
    std::unique_ptr<_IO_FILE,_std::default_delete<_IO_FILE>_>::operator=
              (&this->file_,(nullptr_t)0x0);
    this->dropped_mem_length_ = 0;
    this->bytes_since_flush_ = 0;
    this->file_length_ = 0;
    this->rollover_attempt_ = 0x1f;
  }
  bVar1 = std::operator==(&this->file_,(nullptr_t)0x0);
  if (bVar1) {
    uVar6 = this->rollover_attempt_ + 1;
    this->rollover_attempt_ = uVar6;
    if (uVar6 == 0x20) {
      this->rollover_attempt_ = 0;
      local_b0 = std::chrono::_V2::system_clock::to_time_t(timestamp);
      if ((fLB::FLAGS_log_utc_time & 1) == 0) {
        localtime_r(&local_b0,(tm *)&t);
      }
      else {
        gmtime_r(&local_b0,(tm *)&t);
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_228);
      std::ios::fill((char)&local_228 + (char)*(undefined8 *)(local_228 + -0x18));
      poVar8 = (ostream *)std::ostream::operator<<(&local_228,tm_time.tm_mday + 0x76c);
      _Var4 = std::setw(2);
      poVar8 = std::operator<<(poVar8,_Var4);
      poVar8 = (ostream *)std::ostream::operator<<(poVar8,tm_time.tm_hour + 1);
      _Var4 = std::setw(2);
      poVar8 = std::operator<<(poVar8,_Var4);
      poVar8 = (ostream *)std::ostream::operator<<(poVar8,tm_time.tm_min);
      poVar8 = std::operator<<(poVar8,'-');
      _Var4 = std::setw(2);
      poVar8 = std::operator<<(poVar8,_Var4);
      poVar8 = (ostream *)std::ostream::operator<<(poVar8,tm_time.tm_sec);
      _Var4 = std::setw(2);
      poVar8 = std::operator<<(poVar8,_Var4);
      poVar8 = (ostream *)std::ostream::operator<<(poVar8,t._4_4_);
      _Var4 = std::setw(2);
      poVar8 = std::operator<<(poVar8,_Var4);
      poVar8 = (ostream *)std::ostream::operator<<(poVar8,(int)t);
      poVar8 = std::operator<<(poVar8,'.');
      iVar5 = glog_internal_namespace_::GetMainThreadPid();
      std::ostream::operator<<(poVar8,iVar5);
      std::__cxx11::ostringstream::str();
      psVar11 = (string *)((long)&stripped_filename.field_2 + 8);
      if ((this->base_filename_selected_ & 1U) == 0) {
        pcVar14 = glog_internal_namespace_::ProgramInvocationShortName();
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_288,pcVar14,
                   (allocator<char> *)(hostname.field_2._M_local_buf + 0xf));
        std::allocator<char>::~allocator((allocator<char> *)(hostname.field_2._M_local_buf + 0xf));
        std::__cxx11::string::string((string *)(uidname.field_2._M_local_buf + 8));
        GetHostName((string *)(uidname.field_2._M_local_buf + 8));
        psVar10 = glog_internal_namespace_::MyUserName_abi_cxx11_();
        std::__cxx11::string::string((string *)local_2d0,(string *)psVar10);
        uVar7 = std::__cxx11::string::empty();
        if ((uVar7 & 1) != 0) {
          std::__cxx11::string::operator=((string *)local_2d0,"invalid-user");
        }
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &log_dirs,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_288,'.');
        std::operator+(&local_390,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &log_dirs,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)&uidname.field_2 + 8));
        std::operator+(&local_370,&local_390,'.');
        std::operator+(&local_350,&local_370,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_2d0);
        std::operator+(&local_330,&local_350,".log.");
        std::operator+(&local_310,&local_330,
                       *(char **)(LogSeverityNames + (ulong)this->severity_ * 8));
        std::operator+(&local_2f0,&local_310,'.');
        std::__cxx11::string::operator=((string *)local_288,(string *)&local_2f0);
        std::__cxx11::string::~string((string *)&local_2f0);
        std::__cxx11::string::~string((string *)&local_310);
        std::__cxx11::string::~string((string *)&local_330);
        std::__cxx11::string::~string((string *)&local_350);
        std::__cxx11::string::~string((string *)&local_370);
        std::__cxx11::string::~string((string *)&local_390);
        std::__cxx11::string::~string((string *)&log_dirs);
        this_00 = GetLoggingDirectories_abi_cxx11_();
        bVar1 = false;
        __end4 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::begin(this_00);
        log_dir = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::end(this_00);
        while (bVar2 = __gnu_cxx::operator!=
                                 (&__end4,(__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                           *)&log_dir), bVar2) {
          local_3e0 = __gnu_cxx::
                      __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ::operator*(&__end4);
          std::operator+(&local_420,local_3e0,"/");
          std::operator+(&local_400,&local_420,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_288);
          std::__cxx11::string::operator=((string *)&this->base_filename_,(string *)&local_400);
          std::__cxx11::string::~string((string *)&local_400);
          std::__cxx11::string::~string((string *)&local_420);
          bVar2 = CreateLogfile(this,psVar11);
          if (bVar2) {
            bVar1 = true;
            break;
          }
          __gnu_cxx::
          __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::operator++(&__end4);
        }
        if (!bVar1) {
          perror("Could not create logging file");
          pFVar13 = _stderr;
          uVar9 = std::__cxx11::string::c_str();
          fprintf(pFVar13,"COULD NOT CREATE A LOGGINGFILE %s!",uVar9);
        }
        bVar1 = !bVar1;
        std::__cxx11::string::~string((string *)local_2d0);
        std::__cxx11::string::~string((string *)(uidname.field_2._M_local_buf + 8));
        std::__cxx11::string::~string((string *)local_288);
        if (!bVar1) goto LAB_00113d37;
      }
      else {
        bVar1 = CreateLogfile(this,psVar11);
        if (bVar1) {
LAB_00113d37:
          if ((fLB::FLAGS_log_file_header & 1) != 0) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_598);
            std::ios::fill((char)local_598 + (char)*(_func_int **)((long)local_598 + -0x18));
            poVar8 = std::operator<<((ostream *)local_598,"Log file created at: ");
            poVar8 = (ostream *)std::ostream::operator<<(poVar8,tm_time.tm_mday + 0x76c);
            poVar8 = std::operator<<(poVar8,'/');
            local_59c = (int)std::setw(2);
            poVar8 = std::operator<<(poVar8,(_Setw)local_59c);
            poVar8 = (ostream *)std::ostream::operator<<(poVar8,tm_time.tm_hour + 1);
            poVar8 = std::operator<<(poVar8,'/');
            local_5a0 = (int)std::setw(2);
            poVar8 = std::operator<<(poVar8,(_Setw)local_5a0);
            poVar8 = (ostream *)std::ostream::operator<<(poVar8,tm_time.tm_min);
            poVar8 = std::operator<<(poVar8,' ');
            local_5a4 = (int)std::setw(2);
            poVar8 = std::operator<<(poVar8,(_Setw)local_5a4);
            poVar8 = (ostream *)std::ostream::operator<<(poVar8,tm_time.tm_sec);
            poVar8 = std::operator<<(poVar8,':');
            local_5a8 = (int)std::setw(2);
            poVar8 = std::operator<<(poVar8,(_Setw)local_5a8);
            poVar8 = (ostream *)std::ostream::operator<<(poVar8,t._4_4_);
            poVar8 = std::operator<<(poVar8,':');
            date_time_format._4_4_ = std::setw(2);
            poVar8 = std::operator<<(poVar8,date_time_format._4_4_);
            poVar8 = (ostream *)std::ostream::operator<<(poVar8,(int)t);
            pcVar14 = "\n";
            if ((fLB::FLAGS_log_utc_time & 1) != 0) {
              pcVar14 = " UTC\n";
            }
            poVar8 = std::operator<<(poVar8,pcVar14);
            poVar8 = std::operator<<(poVar8,"Running on machine: ");
            psVar11 = LogDestination::hostname_abi_cxx11_();
            poVar8 = std::operator<<(poVar8,(string *)psVar11);
            std::operator<<(poVar8,'\n');
            uVar7 = std::__cxx11::string::empty();
            if ((uVar7 & 1) == 0) {
              poVar8 = std::operator<<((ostream *)local_598,"Application fingerprint: ");
              poVar8 = std::operator<<(poVar8,(string *)
                                              (anonymous_namespace)::
                                              g_application_fingerprint_abi_cxx11_);
              std::operator<<(poVar8,'\n');
            }
            local_5b8 = "mmdd hh:mm:ss.uuuuuu";
            if ((fLB::FLAGS_log_year_in_prefix & 1) != 0) {
              local_5b8 = "yyyymmdd hh:mm:ss.uuuuuu";
            }
            poVar8 = std::operator<<((ostream *)local_598,"Running duration (h:mm:ss): ");
            file_header_string = (string *)std::chrono::operator-(timestamp,&this->start_time_);
            local_5dc = (rep_conflict)
                        std::chrono::
                        duration_cast<std::chrono::duration<int,std::ratio<1l,1l>>,long,std::ratio<1l,1000000000l>>
                                  ((duration<long,_std::ratio<1L,_1000000000L>_> *)
                                   &file_header_string);
            (anonymous_namespace)::PrettyDuration_abi_cxx11_
                      (&local_5d8,(_anonymous_namespace_ *)&local_5dc,secs);
            poVar8 = std::operator<<(poVar8,(string *)&local_5d8);
            poVar8 = std::operator<<(poVar8,'\n');
            poVar8 = std::operator<<(poVar8,"Log line format: [IWEF]");
            poVar8 = std::operator<<(poVar8,local_5b8);
            poVar8 = std::operator<<(poVar8," ");
            poVar8 = std::operator<<(poVar8,"threadid file:line] msg");
            std::operator<<(poVar8,'\n');
            std::__cxx11::string::~string((string *)&local_5d8);
            std::__cxx11::ostringstream::str();
            local_5f0 = &header_len;
            __n_00 = std::__cxx11::string::size();
            __ptr = (void *)std::__cxx11::string::data();
            pFVar13 = (FILE *)std::unique_ptr<_IO_FILE,_std::default_delete<_IO_FILE>_>::get
                                        (&this->file_);
            fwrite(__ptr,1,__n_00,pFVar13);
            this->file_length_ = this->file_length_ + (int)__n_00;
            this->bytes_since_flush_ = this->bytes_since_flush_ + (int)__n_00;
            std::__cxx11::string::~string((string *)&header_len);
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_598);
          }
          bVar1 = false;
        }
        else {
          perror("Could not create log file");
          pFVar13 = _stderr;
          uVar9 = std::__cxx11::string::c_str();
          fprintf(pFVar13,"COULD NOT CREATE LOGFILE \'%s\'!\n",uVar9);
          bVar1 = true;
        }
      }
      std::__cxx11::string::~string((string *)(stripped_filename.field_2._M_local_buf + 8));
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_228);
      if (!bVar1) goto LAB_0011439b;
    }
  }
  else {
LAB_0011439b:
    if ((stop_writing & 1) == 0) {
      piVar12 = __errno_location();
      __n = l;
      *piVar12 = 0;
      pFVar13 = (FILE *)std::unique_ptr<_IO_FILE,_std::default_delete<_IO_FILE>_>::get(&this->file_)
      ;
      fwrite(message,1,(size_t)__n._M_device,pFVar13);
      if (((fLB::FLAGS_stop_logging_if_full_disk & 1) == 0) ||
         (piVar12 = __errno_location(), *piVar12 != 0x1c)) {
        this->file_length_ = this->file_length_ + (int)l._M_device;
        this->bytes_since_flush_ = this->bytes_since_flush_ + (int)l._M_device;
        if ((((force_flush) || (999999 < this->bytes_since_flush_)) ||
            (bVar1 = std::chrono::operator>=(timestamp,&this->next_flush_time_), bVar1)) &&
           ((FlushUnlocked(this,timestamp), (fLB::FLAGS_drop_log_memory & 1) != 0 &&
            (0x2fffff < this->file_length_)))) {
          uVar3 = (this->file_length_ & 0xfff00000) - 0x100000;
          uVar6 = uVar3 - this->dropped_mem_length_;
          if (0x1fffff < uVar6) {
            pFVar13 = (FILE *)std::unique_ptr<_IO_FILE,_std::default_delete<_IO_FILE>_>::get
                                        (&this->file_);
            __fd = fileno(pFVar13);
            posix_fadvise(__fd,(ulong)this->dropped_mem_length_,(ulong)uVar6,4);
            this->dropped_mem_length_ = uVar3;
          }
        }
      }
      else {
        stop_writing = 1;
      }
    }
    else {
      bVar1 = std::chrono::operator>=(timestamp,&this->next_flush_time_);
      if (bVar1) {
        stop_writing = 0;
      }
    }
  }
  glog_internal_namespace_::
  ScopedExit<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/sergiud[P]glog/src/logging.cc:1096:22)>
  ::~ScopedExit((ScopedExit<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_sergiud[P]glog_src_logging_cc:1096:22)>
                 *)local_60);
LAB_001145b3:
  std::lock_guard<std::mutex>::~lock_guard(&local_38);
  return;
}

Assistant:

void LogFileObject::Write(
    bool force_flush, const std::chrono::system_clock::time_point& timestamp,
    const char* message, size_t message_len) {
  std::lock_guard<std::mutex> l{mutex_};

  // We don't log if the base_name_ is "" (which means "don't write")
  if (base_filename_selected_ && base_filename_.empty()) {
    return;
  }

  auto cleanupLogs = [this, current_time = timestamp] {
    if (log_cleaner.enabled()) {
      log_cleaner.Run(current_time, base_filename_selected_, base_filename_,
                      filename_extension_);
    }
  };

  // Remove old logs
  ScopedExit<decltype(cleanupLogs)> cleanupAtEnd{cleanupLogs};

  if (file_length_ >> 20U >= MaxLogSize() || PidHasChanged()) {
    file_ = nullptr;
    file_length_ = bytes_since_flush_ = dropped_mem_length_ = 0;
    rollover_attempt_ = kRolloverAttemptFrequency - 1;
  }

  // If there's no destination file, make one before outputting
  if (file_ == nullptr) {
    // Try to rollover the log file every 32 log messages.  The only time
    // this could matter would be when we have trouble creating the log
    // file.  If that happens, we'll lose lots of log messages, of course!
    if (++rollover_attempt_ != kRolloverAttemptFrequency) return;
    rollover_attempt_ = 0;

    struct ::tm tm_time;
    std::time_t t = std::chrono::system_clock::to_time_t(timestamp);

    if (FLAGS_log_utc_time) {
      gmtime_r(&t, &tm_time);
    } else {
      localtime_r(&t, &tm_time);
    }

    // The logfile's filename will have the date/time & pid in it
    ostringstream time_pid_stream;
    time_pid_stream.fill('0');
    time_pid_stream << 1900 + tm_time.tm_year << setw(2) << 1 + tm_time.tm_mon
                    << setw(2) << tm_time.tm_mday << '-' << setw(2)
                    << tm_time.tm_hour << setw(2) << tm_time.tm_min << setw(2)
                    << tm_time.tm_sec << '.' << GetMainThreadPid();
    const string& time_pid_string = time_pid_stream.str();

    if (base_filename_selected_) {
      if (!CreateLogfile(time_pid_string)) {
        perror("Could not create log file");
        fprintf(stderr, "COULD NOT CREATE LOGFILE '%s'!\n",
                time_pid_string.c_str());
        return;
      }
    } else {
      // If no base filename for logs of this severity has been set, use a
      // default base filename of
      // "<program name>.<hostname>.<user name>.log.<severity level>.".  So
      // logfiles will have names like
      // webserver.examplehost.root.log.INFO.19990817-150000.4354, where
      // 19990817 is a date (1999 August 17), 150000 is a time (15:00:00),
      // and 4354 is the pid of the logging process.  The date & time reflect
      // when the file was created for output.
      //
      // Where does the file get put?  Successively try the directories
      // "/tmp", and "."
      string stripped_filename(
          glog_internal_namespace_::ProgramInvocationShortName());
      string hostname;
      GetHostName(&hostname);

      string uidname = MyUserName();
      // We should not call CHECK() here because this function can be
      // called after holding on to log_mutex. We don't want to
      // attempt to hold on to the same mutex, and get into a
      // deadlock. Simply use a name like invalid-user.
      if (uidname.empty()) uidname = "invalid-user";

      stripped_filename = stripped_filename + '.' + hostname + '.' + uidname +
                          ".log." + LogSeverityNames[severity_] + '.';
      // We're going to (potentially) try to put logs in several different dirs
      const vector<string>& log_dirs = GetLoggingDirectories();

      // Go through the list of dirs, and try to create the log file in each
      // until we succeed or run out of options
      bool success = false;
      for (const auto& log_dir : log_dirs) {
        base_filename_ = log_dir + "/" + stripped_filename;
        if (CreateLogfile(time_pid_string)) {
          success = true;
          break;
        }
      }
      // If we never succeeded, we have to give up
      if (success == false) {
        perror("Could not create logging file");
        fprintf(stderr, "COULD NOT CREATE A LOGGINGFILE %s!",
                time_pid_string.c_str());
        return;
      }
    }

    // Write a header message into the log file
    if (FLAGS_log_file_header) {
      ostringstream file_header_stream;
      file_header_stream.fill('0');
      file_header_stream << "Log file created at: " << 1900 + tm_time.tm_year
                         << '/' << setw(2) << 1 + tm_time.tm_mon << '/'
                         << setw(2) << tm_time.tm_mday << ' ' << setw(2)
                         << tm_time.tm_hour << ':' << setw(2) << tm_time.tm_min
                         << ':' << setw(2) << tm_time.tm_sec
                         << (FLAGS_log_utc_time ? " UTC\n" : "\n")
                         << "Running on machine: " << LogDestination::hostname()
                         << '\n';

      if (!g_application_fingerprint.empty()) {
        file_header_stream << "Application fingerprint: "
                           << g_application_fingerprint << '\n';
      }
      const char* const date_time_format = FLAGS_log_year_in_prefix
                                               ? "yyyymmdd hh:mm:ss.uuuuuu"
                                               : "mmdd hh:mm:ss.uuuuuu";
      file_header_stream
          << "Running duration (h:mm:ss): "
          << PrettyDuration(
                 std::chrono::duration_cast<std::chrono::duration<int>>(
                     timestamp - start_time_))
          << '\n'
          << "Log line format: [IWEF]" << date_time_format << " "
          << "threadid file:line] msg" << '\n';
      const string& file_header_string = file_header_stream.str();

      const size_t header_len = file_header_string.size();
      fwrite(file_header_string.data(), 1, header_len, file_.get());
      file_length_ += header_len;
      bytes_since_flush_ += header_len;
    }
  }

  // Write to LOG file
  if (!stop_writing) {
    // fwrite() doesn't return an error when the disk is full, for
    // messages that are less than 4096 bytes. When the disk is full,
    // it returns the message length for messages that are less than
    // 4096 bytes. fwrite() returns 4096 for message lengths that are
    // greater than 4096, thereby indicating an error.
    errno = 0;
    fwrite(message, 1, message_len, file_.get());
    if (FLAGS_stop_logging_if_full_disk &&
        errno == ENOSPC) {  // disk full, stop writing to disk
      stop_writing = true;  // until the disk is
      return;
    } else {
      file_length_ += message_len;
      bytes_since_flush_ += message_len;
    }
  } else {
    if (timestamp >= next_flush_time_) {
      stop_writing = false;  // check to see if disk has free space.
    }
    return;  // no need to flush
  }

  // See important msgs *now*.  Also, flush logs at least every 10^6 chars,
  // or every "FLAGS_logbufsecs" seconds.
  if (force_flush || (bytes_since_flush_ >= 1000000) ||
      (timestamp >= next_flush_time_)) {
    FlushUnlocked(timestamp);
#ifdef GLOG_OS_LINUX
    // Only consider files >= 3MiB
    if (FLAGS_drop_log_memory && file_length_ >= (3U << 20U)) {
      // Don't evict the most recent 1-2MiB so as not to impact a tailer
      // of the log file and to avoid page rounding issue on linux < 4.7
      uint32 total_drop_length =
          (file_length_ & ~((1U << 20U) - 1U)) - (1U << 20U);
      uint32 this_drop_length = total_drop_length - dropped_mem_length_;
      if (this_drop_length >= (2U << 20U)) {
        // Only advise when >= 2MiB to drop
#  if defined(__ANDROID__) && defined(__ANDROID_API__) && (__ANDROID_API__ < 21)
        // 'posix_fadvise' introduced in API 21:
        // * https://android.googlesource.com/platform/bionic/+/6880f936173081297be0dc12f687d341b86a4cfa/libc/libc.map.txt#732
#  else
        posix_fadvise(
            fileno(file_.get()), static_cast<off_t>(dropped_mem_length_),
            static_cast<off_t>(this_drop_length), POSIX_FADV_DONTNEED);
#  endif
        dropped_mem_length_ = total_drop_length;
      }
    }
#endif
  }
}